

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

error_code __thiscall
anon_unknown.dwarf_1146b::yaml_output::string_value(yaml_output *this,string *s)

{
  string *this_00;
  error_code eVar1;
  string local_50 [32];
  string *local_30;
  string *local_28;
  string *s_local;
  yaml_output *this_local;
  error_category *local_10;
  
  local_28 = (string *)s;
  s_local = (string *)this;
  this_00 = (string *)operator_new(0x30);
  std::__cxx11::string::string(local_50,local_28);
  pstore::dump::string::string(this_00,(string *)local_50,false);
  local_30 = this_00;
  std::
  stack<std::shared_ptr<pstore::dump::value>,std::deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>>
  ::emplace<pstore::dump::string*>
            ((stack<std::shared_ptr<pstore::dump::value>,std::deque<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>>
              *)this,&local_30);
  std::__cxx11::string::~string(local_50);
  std::error_code::error_code((error_code *)&this_local);
  eVar1._4_4_ = 0;
  eVar1._M_value = (uint)this_local;
  eVar1._M_cat = local_10;
  return eVar1;
}

Assistant:

std::error_code yaml_output::string_value (std::string const & s) {
        out_.emplace (new pstore::dump::string (s));
        return {};
    }